

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.h
# Opt level: O3

void __thiscall
yyml::nn::Variable<double>::Variable(Variable<double> *this,Variable<double> *param_1)

{
  pointer pcVar1;
  
  Tensor<double>::Tensor(&this->values_,&param_1->values_);
  Tensor<double>::Tensor(&this->grads_,&param_1->grads_);
  std::vector<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>::vector
            (&(this->autograd_).next,&(param_1->autograd_).next);
  (this->autograd_).variable_ptr = (param_1->autograd_).variable_ptr;
  std::function<void_()>::function(&(this->autograd_).backward_fn,&(param_1->autograd_).backward_fn)
  ;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (param_1->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + (param_1->name_)._M_string_length);
  return;
}

Assistant:

Variable(TensorShape shape)
      : values_(shape),
        grads_(shape),
        autograd_({}, this, nullptr),
        name_("") {}